

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_internalformativ(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextInfo *pCVar2;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  GLint local_58 [2];
  GLint params [16];
  NegativeTestContext *ctx_local;
  
  deMemset(local_58,0xcd,0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"GL_INVALID_VALUE is generated if bufSize is negative.",&local_79);
  NegativeTestContext::beginSection(ctx,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d41,0x8058,0x9380,-1,local_58);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "GL_INVALID_ENUM is generated if pname is not GL_SAMPLES or GL_NUM_SAMPLE_COUNTS.",
             &local_b1);
  NegativeTestContext::beginSection(ctx,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d41,0x8058,0xffffffff,0x10,local_58);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "GL_INVALID_ENUM is generated if internalformat is not color-, depth-, or stencil-renderable."
             ,&local_d9);
  NegativeTestContext::beginSection(ctx,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pCVar2 = NegativeTestContext::getContextInfo(ctx);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar2,"GL_EXT_render_snorm");
  if (!bVar1) {
    glu::CallLogWrapper::glGetInternalformativ
              (&ctx->super_CallLogWrapper,0x8d41,0x8f95,0x9380,0x10,local_58);
    NegativeTestContext::expectError(ctx,0x500);
  }
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d41,0x9274,0x9380,0x10,local_58);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"GL_INVALID_ENUM is generated if target is not GL_RENDERBUFFER.",
             &local_101);
  NegativeTestContext::beginSection(ctx,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0xffffffff,0x8058,0x9380,0x10,local_58);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d40,0x8058,0x9380,0x10,local_58);
  NegativeTestContext::expectError(ctx,0x500);
  pCVar2 = NegativeTestContext::getContextInfo(ctx);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar2,"GL_EXT_sparse_texture");
  if (!bVar1) {
    glu::CallLogWrapper::glGetInternalformativ
              (&ctx->super_CallLogWrapper,0xde1,0x8058,0x9380,0x10,local_58);
    NegativeTestContext::expectError(ctx,0x500);
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_internalformativ (NegativeTestContext& ctx)
{
	GLint params[16];

	deMemset(&params[0], 0xcd, sizeof(params));

	ctx.beginSection("GL_INVALID_VALUE is generated if bufSize is negative.");
	ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, -1, &params[0]);
	ctx.expectError				(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not GL_SAMPLES or GL_NUM_SAMPLE_COUNTS.");
	ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_RGBA8, -1, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if internalformat is not color-, depth-, or stencil-renderable.");

	if (!ctx.getContextInfo().isExtensionSupported("GL_EXT_render_snorm"))
	{
		ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_RG8_SNORM, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
		ctx.expectError				(GL_INVALID_ENUM);
	}

	ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_COMPRESSED_RGB8_ETC2, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not GL_RENDERBUFFER.");
	ctx.glGetInternalformativ	(-1, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.glGetInternalformativ	(GL_FRAMEBUFFER, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);

	if (!ctx.getContextInfo().isExtensionSupported("GL_EXT_sparse_texture"))
	{
		ctx.glGetInternalformativ	(GL_TEXTURE_2D, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
		ctx.expectError				(GL_INVALID_ENUM);
	}

	ctx.endSection();
}